

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O1

bool __thiscall
cmBinUtilsLinuxELFLinker::ResolveDependency
          (cmBinUtilsLinuxELFLinker *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *searchPaths,string *path,bool *resolved)

{
  pointer pbVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  ostream *poVar4;
  cmMakefile *this_00;
  pointer pbVar5;
  bool bVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  ostringstream warning;
  string local_1f8;
  string local_1c8;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  size_type local_188;
  pointer local_180;
  ios_base local_138 [264];
  
  pbVar5 = (searchPaths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (searchPaths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = pbVar5 == pbVar1;
  if (!bVar6) {
    do {
      local_1a8._8_8_ = (pbVar5->_M_dataplus)._M_p;
      local_1a8._0_8_ = pbVar5->_M_string_length;
      local_1f8._M_dataplus._M_p = &DAT_00000001;
      local_1f8._M_string_length = (size_type)&local_1f8.field_2;
      local_1f8.field_2._M_local_buf[0] = '/';
      local_198 = 1;
      local_180 = (name->_M_dataplus)._M_p;
      local_188 = name->_M_string_length;
      views._M_len = 3;
      views._M_array = (iterator)local_1a8;
      local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_string_length;
      cmCatViews_abi_cxx11_(&local_1c8,views);
      std::__cxx11::string::operator=((string *)path,(string *)&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      bVar2 = cmsys::SystemTools::PathExists(path);
      if ((bVar2) &&
         (bVar2 = anon_unknown.dwarf_1ee4425::FileHasArchitecture
                            ((path->_M_dataplus)._M_p,this->Machine), bVar2)) {
        *resolved = true;
        if (!bVar6) {
          return true;
        }
        break;
      }
      pbVar5 = pbVar5 + 1;
      bVar6 = pbVar5 == pbVar1;
    } while (!bVar6);
  }
  pvVar3 = cmRuntimeDependencyArchive::GetSearchDirectories_abi_cxx11_
                     ((this->super_cmBinUtilsLinker).Archive);
  pbVar5 = (pvVar3->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pvVar3->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = pbVar5 == pbVar1;
  if (!bVar6) {
    do {
      local_1a8._8_8_ = (pbVar5->_M_dataplus)._M_p;
      local_1a8._0_8_ = pbVar5->_M_string_length;
      local_1f8._M_dataplus._M_p = &DAT_00000001;
      local_1f8._M_string_length = (size_type)&local_1f8.field_2;
      local_1f8.field_2._M_local_buf[0] = '/';
      local_198 = 1;
      local_180 = (name->_M_dataplus)._M_p;
      local_188 = name->_M_string_length;
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_1a8;
      local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_string_length;
      cmCatViews_abi_cxx11_(&local_1c8,views_00);
      std::__cxx11::string::operator=((string *)path,(string *)&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      bVar2 = cmsys::SystemTools::PathExists(path);
      if ((bVar2) &&
         (bVar2 = anon_unknown.dwarf_1ee4425::FileHasArchitecture
                            ((path->_M_dataplus)._M_p,this->Machine), bVar2)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Dependency ",0xb);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4," found in search directory:\n  ",0x1e);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"\nSee file(GET_RUNTIME_DEPENDENCIES) documentation for ",0x36);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"more information.",0x11);
        this_00 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmBinUtilsLinker).Archive);
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(this_00,WARNING,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,
                          CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                                   local_1f8.field_2._M_local_buf[0]) + 1);
        }
        *resolved = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if (!bVar6) {
          return true;
        }
        break;
      }
      pbVar5 = pbVar5 + 1;
      bVar6 = pbVar5 == pbVar1;
    } while (!bVar6);
  }
  *resolved = false;
  return true;
}

Assistant:

bool cmBinUtilsLinuxELFLinker::ResolveDependency(
  std::string const& name, std::vector<std::string> const& searchPaths,
  std::string& path, bool& resolved)
{
  for (auto const& searchPath : searchPaths) {
    path = cmStrCat(searchPath, '/', name);
    if (cmSystemTools::PathExists(path) &&
        FileHasArchitecture(path.c_str(), this->Machine)) {
      resolved = true;
      return true;
    }
  }

  for (auto const& searchPath : this->Archive->GetSearchDirectories()) {
    path = cmStrCat(searchPath, '/', name);
    if (cmSystemTools::PathExists(path) &&
        FileHasArchitecture(path.c_str(), this->Machine)) {
      std::ostringstream warning;
      warning << "Dependency " << name << " found in search directory:\n  "
              << searchPath
              << "\nSee file(GET_RUNTIME_DEPENDENCIES) documentation for "
              << "more information.";
      this->Archive->GetMakefile()->IssueMessage(MessageType::WARNING,
                                                 warning.str());
      resolved = true;
      return true;
    }
  }

  resolved = false;
  return true;
}